

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_inspect(REF_CELL ref_cell)

{
  int local_18;
  uint local_14;
  REF_INT node;
  REF_INT cell;
  REF_CELL ref_cell_local;
  
  printf("ref_cell = %p\n",ref_cell);
  printf(" size_per = %d\n",(ulong)(uint)ref_cell->size_per);
  printf(" node_per = %d\n",(ulong)(uint)ref_cell->node_per);
  printf(" n = %d\n",(ulong)(uint)ref_cell->n);
  printf(" max = %d\n",(ulong)(uint)ref_cell->max);
  printf(" blank = %d\n",(ulong)(uint)ref_cell->blank);
  for (local_14 = 0; (int)local_14 < ref_cell->max; local_14 = local_14 + 1) {
    if ((-1 < (int)local_14) && ((int)local_14 < ref_cell->max)) {
      if (ref_cell->c2n[(int)(ref_cell->size_per * local_14)] != -1) {
        printf(" %d:",(ulong)local_14);
        for (local_18 = 0; local_18 < ref_cell->size_per; local_18 = local_18 + 1) {
          printf(" %d",(ulong)(uint)ref_cell->c2n[(int)(local_18 + ref_cell->size_per * local_14)]);
        }
        printf("\n");
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_inspect(REF_CELL ref_cell) {
  REF_INT cell, node;
  printf("ref_cell = %p\n", (void *)ref_cell);
  printf(" size_per = %d\n", ref_cell_size_per(ref_cell));
  printf(" node_per = %d\n", ref_cell_node_per(ref_cell));
  printf(" n = %d\n", ref_cell_n(ref_cell));
  printf(" max = %d\n", ref_cell_max(ref_cell));
  printf(" blank = %d\n", ref_cell->blank);
  for (cell = 0; cell < ref_cell_max(ref_cell); cell++) {
    if (ref_cell_valid(ref_cell, cell)) {
      printf(" %d:", cell);
      for (node = 0; node < ref_cell_size_per(ref_cell); node++)
        printf(" %d", ref_cell_c2n(ref_cell, node, cell));
      printf("\n");
    }
  }

  return REF_SUCCESS;
}